

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O1

void __thiscall DepsLog::~DepsLog(DepsLog *this)

{
  pointer ppDVar1;
  pointer ppNVar2;
  
  if ((FILE *)this->file_ != (FILE *)0x0) {
    fclose((FILE *)this->file_);
  }
  this->file_ = (FILE *)0x0;
  ppDVar1 = (this->deps_).super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppDVar1 != (pointer)0x0) {
    operator_delete(ppDVar1,(long)(this->deps_).
                                  super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppDVar1
                   );
  }
  ppNVar2 = (this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar2 != (pointer)0x0) {
    operator_delete(ppNVar2,(long)(this->nodes_).super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppNVar2
                   );
    return;
  }
  return;
}

Assistant:

DepsLog::~DepsLog() {
  Close();
}